

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O1

void __thiscall Solver::Solver(Solver *this,Board *board)

{
  _Rb_tree_header *p_Var1;
  
  this->numberOfNodes = 0;
  p_Var1 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
  (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->steps).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->steps).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->steps).super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Board::Board(&this->board);
  memcpy(&this->board,board,0x90);
  std::__cxx11::string::_M_assign((string *)&(this->board).identifier);
  std::__cxx11::string::_M_assign((string *)&(this->board).referrer);
  std::vector<Block,_std::allocator<Block>_>::operator=(&(this->board).blocks,&board->blocks);
  return;
}

Assistant:

Solver::Solver(Board board) {
    this->board = board;
}